

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O1

void __thiscall
Assimp::LWOImporter::ComputeNormals
          (LWOImporter *this,aiMesh *mesh,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *smoothingGroups,Surface *surface)

{
  uint uVar1;
  uint uVar2;
  aiVector3D *paVar3;
  undefined8 uVar4;
  aiVector3D *paVar5;
  ulong uVar6;
  pointer puVar7;
  pointer puVar8;
  aiFace *paVar9;
  aiFace *paVar10;
  aiFace *face;
  uint *puVar11;
  aiFace *face_1;
  uint32_t *puVar12;
  uint *puVar13;
  uint uVar14;
  float fVar15;
  ai_real pRadius;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  vector<unsigned_int,_std::allocator<unsigned_int>_> poResult;
  aiFace *face_2;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> faceNormals;
  vector<bool,_std::allocator<bool>_> vertexDone;
  SGSpatialSort sSort;
  allocator_type local_10a;
  bool local_109;
  undefined1 local_108 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_f8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_d8;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  aiFace *local_a0;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_98;
  vector<bool,_std::allocator<bool>_> local_80;
  SGSpatialSort local_58;
  
  local_108._8_8_ = local_108._0_8_;
  local_108._0_8_ = surface;
  uVar1 = mesh->mNumVertices;
  uVar6 = (ulong)uVar1;
  local_d8 = smoothingGroups;
  paVar5 = (aiVector3D *)operator_new__(uVar6 * 0xc);
  if (uVar1 != 0) {
    memset(paVar5,0,((uVar6 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
  }
  mesh->mNormals = paVar5;
  local_98.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (aiVector3D *)0x0;
  local_98.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar4 = local_108._0_8_;
  if ((*(float *)(local_108._0_8_ + 0x48) != 0.0) || (NAN(*(float *)(local_108._0_8_ + 0x48)))) {
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize(&local_98,uVar6);
    paVar5 = local_98.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
  }
  paVar10 = mesh->mFaces;
  paVar9 = paVar10 + mesh->mNumFaces;
  if ((ulong)mesh->mNumFaces != 0) {
    do {
      if (2 < paVar10->mNumIndices) {
        paVar3 = mesh->mVertices;
        puVar11 = paVar10->mIndices;
        uVar1 = *puVar11;
        uVar2 = puVar11[1];
        uVar14 = puVar11[paVar10->mNumIndices - 1];
        fVar15 = paVar3[uVar2].x - paVar3[uVar1].x;
        fVar16 = paVar3[uVar2].y - paVar3[uVar1].y;
        fVar21 = paVar3[uVar2].z - paVar3[uVar1].z;
        fVar19 = paVar3[uVar14].x - paVar3[uVar1].x;
        fVar20 = paVar3[uVar14].y - paVar3[uVar1].y;
        fVar17 = paVar3[uVar14].z - paVar3[uVar1].z;
        fVar18 = fVar16 * fVar17 - fVar20 * fVar21;
        fVar17 = fVar21 * fVar19 - fVar17 * fVar15;
        fVar16 = fVar20 * fVar15 - fVar19 * fVar16;
        fVar15 = fVar16 * fVar16 + fVar18 * fVar18 + fVar17 * fVar17;
        if (fVar15 < 0.0) {
          local_b8 = ZEXT416((uint)fVar17);
          local_c8 = ZEXT416((uint)fVar18);
          fVar15 = sqrtf(fVar15);
          fVar18 = (float)local_c8._0_4_;
          fVar17 = (float)local_b8._0_4_;
        }
        else {
          fVar15 = SQRT(fVar15);
        }
        if (paVar10->mNumIndices != 0) {
          fVar15 = 1.0 / fVar15;
          uVar6 = 0;
          do {
            uVar1 = paVar10->mIndices[uVar6];
            paVar5[uVar1].x = fVar18 * fVar15;
            paVar5[uVar1].y = fVar17 * fVar15;
            paVar5[uVar1].z = fVar16 * fVar15;
            uVar6 = uVar6 + 1;
          } while (uVar6 < paVar10->mNumIndices);
        }
      }
      paVar10 = paVar10 + 1;
    } while (paVar10 != paVar9);
  }
  if ((*(float *)(uVar4 + 0x48) != 0.0) || (NAN(*(float *)(uVar4 + 0x48)))) {
    pRadius = ComputePositionEpsilon(mesh);
    SGSpatialSort::SGSpatialSort(&local_58);
    paVar10 = mesh->mFaces;
    if (paVar10 != paVar9) {
      puVar11 = (local_d8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      do {
        if (paVar10->mNumIndices != 0) {
          uVar6 = 0;
          do {
            SGSpatialSort::Add(&local_58,mesh->mVertices + paVar10->mIndices[uVar6],
                               paVar10->mIndices[uVar6],*puVar11);
            uVar6 = uVar6 + 1;
          } while (uVar6 < paVar10->mNumIndices);
        }
        paVar10 = paVar10 + 1;
        puVar11 = puVar11 + 1;
      } while (paVar10 != paVar9);
    }
    SGSpatialSort::Prepare(&local_58);
    local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (uint *)0x0;
    local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (uint *)0x0;
    local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&local_f8,0x14);
    if ((3.0 <= *(float *)(local_108._0_8_ + 0x48)) || (this->configSpeedFlag != false)) {
      local_109 = false;
      std::vector<bool,_std::allocator<bool>_>::vector
                (&local_80,(ulong)mesh->mNumVertices,&local_109,&local_10a);
      paVar10 = mesh->mFaces;
      if (paVar10 != paVar9) {
        puVar12 = (local_d8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          if ((ulong)paVar10->mNumIndices != 0) {
            puVar11 = paVar10->mIndices;
            puVar13 = puVar11 + paVar10->mNumIndices;
            do {
              uVar1 = *puVar11;
              if ((local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar1 >> 6] >>
                   ((ulong)uVar1 & 0x3f) & 1) == 0) {
                SGSpatialSort::FindPositions
                          (&local_58,mesh->mVertices + uVar1,*puVar12,pRadius,&local_f8,true);
                puVar8 = local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
                if (local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start ==
                    local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_finish) {
                  fVar17 = 0.0;
                  fVar15 = 0.0;
                  fVar18 = 0.0;
                }
                else {
                  fVar18 = 0.0;
                  fVar15 = 0.0;
                  fVar17 = 0.0;
                  puVar7 = local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                  do {
                    uVar1 = *puVar7;
                    fVar18 = fVar18 + local_98.
                                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar1].x;
                    fVar15 = fVar15 + local_98.
                                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar1].y;
                    fVar17 = fVar17 + local_98.
                                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar1].z;
                    puVar7 = puVar7 + 1;
                  } while (puVar7 != local_f8.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish);
                }
                fVar16 = fVar17 * fVar17 + fVar18 * fVar18 + fVar15 * fVar15;
                if (fVar16 < 0.0) {
                  local_b8._0_4_ = fVar18;
                  local_c8._0_4_ = fVar17;
                  local_108._0_4_ = fVar15;
                  fVar16 = sqrtf(fVar16);
                  fVar18 = (float)local_b8._0_4_;
                  fVar17 = (float)local_c8._0_4_;
                  fVar15 = (float)local_108._0_4_;
                }
                else {
                  fVar16 = SQRT(fVar16);
                }
                if (local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start != puVar8) {
                  fVar16 = 1.0 / fVar16;
                  puVar7 = local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                  do {
                    paVar5 = mesh->mNormals;
                    uVar1 = *puVar7;
                    paVar5[uVar1].x = fVar18 * fVar16;
                    paVar5[uVar1].y = fVar15 * fVar16;
                    paVar5[uVar1].z = fVar17 * fVar16;
                    local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[*puVar7 >> 6] =
                         local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                         [*puVar7 >> 6] | 1L << ((byte)*puVar7 & 0x3f);
                    puVar7 = puVar7 + 1;
                  } while (puVar7 != puVar8);
                }
              }
              puVar11 = puVar11 + 1;
            } while (puVar11 != puVar13);
          }
          paVar10 = paVar10 + 1;
          puVar12 = puVar12 + 1;
        } while (paVar10 != paVar9);
      }
      if (local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_offset = 0;
        local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_offset = 0;
        local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage = (_Bit_pointer)0x0;
      }
    }
    else {
      fVar18 = cosf(*(float *)(local_108._0_8_ + 0x48));
      local_b8._0_4_ = fVar18;
      paVar10 = mesh->mFaces;
      if (paVar10 != paVar9) {
        puVar12 = (local_d8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          local_a0 = paVar10;
          if ((ulong)paVar10->mNumIndices != 0) {
            puVar11 = paVar10->mIndices;
            puVar13 = puVar11 + paVar10->mNumIndices;
            do {
              uVar1 = *puVar11;
              SGSpatialSort::FindPositions
                        (&local_58,mesh->mVertices + uVar1,*puVar12,pRadius,&local_f8,true);
              if (local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start ==
                  local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                fVar18 = 0.0;
                fVar15 = 0.0;
                fVar17 = 0.0;
              }
              else {
                fVar17 = 0.0;
                fVar15 = 0.0;
                fVar18 = 0.0;
                puVar8 = local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                do {
                  uVar2 = *puVar8;
                  fVar16 = local_98.
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar2].z *
                           local_98.
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar1].z +
                           local_98.
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar2].x *
                           local_98.
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar1].x +
                           local_98.
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar2].y *
                           local_98.
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar1].y;
                  if ((float)local_b8._0_4_ <= fVar16) {
                    fVar15 = fVar15 + local_98.
                                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar2].y;
                    fVar17 = fVar17 + local_98.
                                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar2].z;
                  }
                  uVar14 = -(uint)(fVar16 < (float)local_b8._0_4_);
                  fVar18 = (float)((uint)fVar18 & uVar14 |
                                  ~uVar14 & (uint)(local_98.
                                                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar2].x
                                                  + fVar18));
                  puVar8 = puVar8 + 1;
                } while (puVar8 != local_f8.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish);
              }
              fVar16 = fVar17 * fVar17 + fVar18 * fVar18 + fVar15 * fVar15;
              if (fVar16 < 0.0) {
                local_c8 = ZEXT416((uint)fVar17);
                local_108 = ZEXT416((uint)fVar15);
                local_d8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           (ulong)(uint)fVar18;
                uStack_d0 = 0;
                uStack_cc = 0;
                fVar16 = sqrtf(fVar16);
                fVar17 = (float)local_c8._0_4_;
                fVar15 = (float)local_108._0_4_;
                fVar18 = local_d8._0_4_;
              }
              else {
                fVar16 = SQRT(fVar16);
              }
              fVar16 = 1.0 / fVar16;
              paVar5 = mesh->mNormals;
              paVar5[uVar1].x = fVar18 * fVar16;
              paVar5[uVar1].y = fVar15 * fVar16;
              paVar5[uVar1].z = fVar17 * fVar16;
              puVar11 = puVar11 + 1;
            } while (puVar11 != puVar13);
          }
          paVar10 = local_a0 + 1;
          puVar12 = puVar12 + 1;
        } while (paVar10 != paVar9);
      }
    }
    if (local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (uint *)0x0) {
      operator_delete(local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    SGSpatialSort::~SGSpatialSort(&local_58);
  }
  if (local_98.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (aiVector3D *)0x0) {
    operator_delete(local_98.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void LWOImporter::ComputeNormals(aiMesh* mesh, const std::vector<unsigned int>& smoothingGroups,
    const LWO::Surface& surface)
{
    // Allocate output storage
    mesh->mNormals = new aiVector3D[mesh->mNumVertices];

    // First generate per-face normals
    aiVector3D* out;
    std::vector<aiVector3D> faceNormals;

    // ... in some cases that's already enough
    if (!surface.mMaximumSmoothAngle)
        out = mesh->mNormals;
    else    {
        faceNormals.resize(mesh->mNumVertices);
        out = &faceNormals[0];
    }

    aiFace* begin = mesh->mFaces, *const end = mesh->mFaces+mesh->mNumFaces;
    for (; begin != end; ++begin)   {
        aiFace& face = *begin;

        if(face.mNumIndices < 3) {
            continue;
        }

        // LWO doc: "the normal is defined as the cross product of the first and last edges"
        aiVector3D* pV1 = mesh->mVertices + face.mIndices[0];
        aiVector3D* pV2 = mesh->mVertices + face.mIndices[1];
        aiVector3D* pV3 = mesh->mVertices + face.mIndices[face.mNumIndices-1];

        aiVector3D vNor = ((*pV2 - *pV1) ^(*pV3 - *pV1)).Normalize();
        for (unsigned int i = 0; i < face.mNumIndices;++i)
            out[face.mIndices[i]] = vNor;
    }
    if (!surface.mMaximumSmoothAngle)return;
    const float posEpsilon = ComputePositionEpsilon(mesh);

    // Now generate the spatial sort tree
    SGSpatialSort sSort;
    std::vector<unsigned int>::const_iterator it = smoothingGroups.begin();
    for( begin =  mesh->mFaces; begin != end; ++begin, ++it)
    {
        aiFace& face = *begin;
        for (unsigned int i = 0; i < face.mNumIndices;++i)
        {
            unsigned int tt = face.mIndices[i];
            sSort.Add(mesh->mVertices[tt],tt,*it);
        }
    }
    // Sort everything - this takes O(nlogn) time
    sSort.Prepare();
    std::vector<unsigned int> poResult;
    poResult.reserve(20);

    // Generate vertex normals. We have O(logn) for the binary lookup, which we need
    // for n elements, thus the EXPECTED complexity is O(nlogn)
    if (surface.mMaximumSmoothAngle < 3.f && !configSpeedFlag)  {
        const float fLimit = std::cos(surface.mMaximumSmoothAngle);

        for( begin =  mesh->mFaces, it = smoothingGroups.begin(); begin != end; ++begin, ++it)  {
            const aiFace& face = *begin;
            unsigned int* beginIdx = face.mIndices, *const endIdx = face.mIndices+face.mNumIndices;
            for (; beginIdx != endIdx; ++beginIdx)
            {
                unsigned int idx = *beginIdx;
                sSort.FindPositions(mesh->mVertices[idx],*it,posEpsilon,poResult,true);
                std::vector<unsigned int>::const_iterator a, end = poResult.end();

                aiVector3D vNormals;
                for (a =  poResult.begin();a != end;++a)    {
                    const aiVector3D& v = faceNormals[*a];
                    if (v * faceNormals[idx] < fLimit)
                        continue;
                    vNormals += v;
                }
                mesh->mNormals[idx] = vNormals.Normalize();
            }
        }
    }
     // faster code path in case there is no smooth angle
    else    {
        std::vector<bool> vertexDone(mesh->mNumVertices,false);
        for( begin =  mesh->mFaces, it = smoothingGroups.begin(); begin != end; ++begin, ++it)  {
            const aiFace& face = *begin;
            unsigned int* beginIdx = face.mIndices, *const endIdx = face.mIndices+face.mNumIndices;
            for (; beginIdx != endIdx; ++beginIdx)
            {
                unsigned int idx = *beginIdx;
                if (vertexDone[idx])
                    continue;
                sSort.FindPositions(mesh->mVertices[idx],*it,posEpsilon,poResult,true);
                std::vector<unsigned int>::const_iterator a, end = poResult.end();

                aiVector3D vNormals;
                for (a =  poResult.begin();a != end;++a)    {
                    const aiVector3D& v = faceNormals[*a];
                    vNormals += v;
                }
                vNormals.Normalize();
                for (a =  poResult.begin();a != end;++a)    {
                    mesh->mNormals[*a] = vNormals;
                    vertexDone[*a] = true;
                }
            }
        }
    }
}